

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GetStringField
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[6])(&local_80,&this->namer_,field);
  std::operator+(&local_a0," ",&local_80);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  TypeName_abi_cxx11_(&local_60,this,field);
  std::operator+(&local_80,"() ",&local_60);
  std::operator+(&local_a0,&local_80," ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  OffsetPrefix_abi_cxx11_(&local_60,this,field);
  std::operator+(&local_80,&local_60,"\t\treturn ");
  GenGetter_abi_cxx11_(&local_40,this,&(field->value).type);
  std::operator+(&local_a0,&local_80,&local_40);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GetStringField(const StructDef &struct_def, const FieldDef &field,
                      std::string *code_ptr) {
    std::string &code = *code_ptr;
    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "() " + TypeName(field) + " ";
    code += OffsetPrefix(field) + "\t\treturn " + GenGetter(field.value.type);
    code += "(o + rcv._tab.Pos)\n\t}\n\treturn nil\n";
    code += "}\n\n";
  }